

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.cpp
# Opt level: O0

flags __thiscall setup::header::load_flags(header *this,istream *is,version *version)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  int_adapter<unsigned_int> *in_RDX;
  undefined8 in_RSI;
  stored_flag_reader<setup::header::flags_Enum_> *in_RDI;
  flag_type fVar4;
  stored_flag_reader<flags<setup::header::flags_Enum_,_65UL>_> flagreader;
  undefined4 in_stack_ffffffffffffff88;
  enum_type in_stack_ffffffffffffff8c;
  enum_type flag;
  flags<setup::header::flags_Enum_,_65UL> *in_stack_ffffffffffffffa0;
  
  flag = (enum_type)((ulong)in_RSI >> 0x20);
  setup::version::bits((version *)in_RDI);
  stored_flag_reader<flags<setup::header::flags_Enum_,_65UL>_>::stored_flag_reader
            ((stored_flag_reader<flags<setup::header::flags_Enum_,_65UL>_> *)in_RDI,
             (istream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0x1757f5);
  stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x5030a00) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x5030300) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x1030600) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x5030300) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((uVar3 < 0x3000000) ||
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), 0x30002ff < uVar3)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x1030300) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x6040001) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x4010200) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x10205ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x1020dff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar2 = setup::version::bits((version *)in_RDI);
  if (uVar2 != 0x10) {
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
    if (uVar3 < 0x3000400) {
      stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    }
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
    if (uVar3 < 0x3000000) {
      stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    }
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
    if (uVar3 < 0x1030600) {
      stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    }
    uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
    if (uVar3 < 0x5060100) {
      stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    }
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x102ffff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), uVar3 < 0x5030800)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x10300ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x10302ff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), uVar3 < 0x6040001)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x10309ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x10313ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x1ffffff < uVar3) ||
     ((bVar1 = setup::version::is_isx((version *)in_RDI), bVar1 &&
      (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), 0x10309ff < uVar3))))
  {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x1ffffff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x20006ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x20010ff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), uVar3 < 0x4010500)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x20011ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x2ffffff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x30000ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x30002ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x3ffffff < uVar3) ||
     ((bVar1 = setup::version::is_isx((version *)in_RDI), bVar1 &&
      (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), 0x30002ff < uVar3))))
  {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x3ffffff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), uVar3 < 0x4000a00)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x40000ff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), uVar3 < 0x4000a00)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x4000900) {
    flags<setup::header::flags_Enum_,_65UL>::operator|=(in_stack_ffffffffffffffa0,flag);
  }
  else {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x40102ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x40107ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x40201ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x50003ff < uVar3) &&
     (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX), uVar3 < 0x5060100)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if ((0x50106ff < uVar3) && (bVar1 = setup::version::is_unicode((version *)in_RDI), !bVar1)) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x5010cff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x50200ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x50307ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x50308ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (uVar3 < 0x5050000) {
    flags<setup::header::flags_Enum_,_65UL>::operator|=(in_stack_ffffffffffffffa0,flag);
  }
  else {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x50506ff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x5ffffff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(in_RDX);
  if (0x602ffff < uVar3) {
    stored_flag_reader<setup::header::flags_Enum_>::add(in_RDI,in_stack_ffffffffffffff8c);
  }
  fVar4 = stored_flag_reader<setup::header::flags_Enum_>::finalize
                    ((stored_flag_reader<setup::header::flags_Enum_> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  return (flags)fVar4._flags.super__Base_bitset<2UL>._M_w;
}

Assistant:

header::flags header::load_flags(std::istream & is, const version & version) {
	
	stored_flag_reader<flags> flagreader(is, version.bits());
	
	flagreader.add(DisableStartupPrompt);
	if(version < INNO_VERSION(5, 3, 10)) {
		flagreader.add(Uninstallable);
	}
	flagreader.add(CreateAppDir);
	if(version < INNO_VERSION(5, 3, 3)) {
		flagreader.add(DisableDirPage);
	}
	if(version < INNO_VERSION(1, 3, 6)) {
		flagreader.add(DisableDirExistsWarning);
	}
	if(version < INNO_VERSION(5, 3, 3)) {
		flagreader.add(DisableProgramGroupPage);
	}
	flagreader.add(AllowNoIcons);
	if(version < INNO_VERSION(3, 0, 0) || version >= INNO_VERSION(3, 0, 3)) {
		flagreader.add(AlwaysRestart);
	}
	if(version < INNO_VERSION(1, 3, 3)) {
		flagreader.add(BackSolid);
	}
	flagreader.add(AlwaysUsePersonalGroup);
	if(version < INNO_VERSION_EXT(6, 4, 0, 1)) {
		flagreader.add(WindowVisible);
		flagreader.add(WindowShowCaption);
		flagreader.add(WindowResizable);
		flagreader.add(WindowStartMaximized);
	}
	flagreader.add(EnableDirDoesntExistWarning);
	if(version < INNO_VERSION(4, 1, 2)) {
		flagreader.add(DisableAppendDir);
	}
	flagreader.add(Password);
	if(version >= INNO_VERSION(1, 2, 6)) {
		flagreader.add(AllowRootDirectory);
	}
	if(version >= INNO_VERSION(1, 2, 14)) {
		flagreader.add(DisableFinishedPage);
	}
	if(version.bits() != 16) {
		if(version < INNO_VERSION(3, 0, 4)) {
			flagreader.add(AdminPrivilegesRequired);
		}
		if(version < INNO_VERSION(3, 0, 0)) {
			flagreader.add(AlwaysCreateUninstallIcon);
		}
		if(version < INNO_VERSION(1, 3, 6)) {
			flagreader.add(OverwriteUninstRegEntries);
		}
		if(version < INNO_VERSION(5, 6, 1)) {
			flagreader.add(ChangesAssociations);
		}
	}
	if(version >= INNO_VERSION(1, 3, 0) && version < INNO_VERSION(5, 3, 8)) {
		flagreader.add(CreateUninstallRegKey);
	}
	if(version >= INNO_VERSION(1, 3, 1)) {
		flagreader.add(UsePreviousAppDir);
	}
	if(version >= INNO_VERSION(1, 3, 3) && version < INNO_VERSION_EXT(6, 4, 0, 1)) {
		flagreader.add(BackColorHorizontal);
	}
	if(version >= INNO_VERSION(1, 3, 10)) {
		flagreader.add(UsePreviousGroup);
	}
	if(version >= INNO_VERSION(1, 3, 20)) {
		flagreader.add(UpdateUninstallLogAppName);
	}
	if(version >= INNO_VERSION(2, 0, 0) || (version.is_isx() && version >= INNO_VERSION(1, 3, 10))) {
		flagreader.add(UsePreviousSetupType);
	}
	if(version >= INNO_VERSION(2, 0, 0)) {
		flagreader.add(DisableReadyMemo);
		flagreader.add(AlwaysShowComponentsList);
		flagreader.add(FlatComponentsList);
		flagreader.add(ShowComponentSizes);
		flagreader.add(UsePreviousTasks);
		flagreader.add(DisableReadyPage);
	}
	if(version >= INNO_VERSION(2, 0, 7)) {
		flagreader.add(AlwaysShowDirOnReadyPage);
		flagreader.add(AlwaysShowGroupOnReadyPage);
	}
	if(version >= INNO_VERSION(2, 0, 17) && version < INNO_VERSION(4, 1, 5)) {
		flagreader.add(BzipUsed);
	}
	if(version >= INNO_VERSION(2, 0, 18)) {
		flagreader.add(AllowUNCPath);
	}
	if(version >= INNO_VERSION(3, 0, 0)) {
		flagreader.add(UserInfoPage);
		flagreader.add(UsePreviousUserInfo);
	}
	if(version >= INNO_VERSION(3, 0, 1)) {
		flagreader.add(UninstallRestartComputer);
	}
	if(version >= INNO_VERSION(3, 0, 3)) {
		flagreader.add(RestartIfNeededByRun);
	}
	if(version >= INNO_VERSION(4, 0, 0) || (version.is_isx() && version >= INNO_VERSION(3, 0, 3))) {
		flagreader.add(ShowTasksTreeLines);
	}
	if(version >= INNO_VERSION(4, 0, 0) && version < INNO_VERSION(4, 0, 10)) {
		flagreader.add(ShowLanguageDialog);
	}
	if(version >= INNO_VERSION(4, 0, 1) && version < INNO_VERSION(4, 0, 10)) {
		flagreader.add(DetectLanguageUsingLocale);
	}
	if(version >= INNO_VERSION(4, 0, 9)) {
		flagreader.add(AllowCancelDuringInstall);
	} else {
		options |= AllowCancelDuringInstall;
	}
	if(version >= INNO_VERSION(4, 1, 3)) {
		flagreader.add(WizardImageStretch);
	}
	if(version >= INNO_VERSION(4, 1, 8)) {
		flagreader.add(AppendDefaultDirName);
		flagreader.add(AppendDefaultGroupName);
	}
	if(version >= INNO_VERSION(4, 2, 2)) {
		flagreader.add(EncryptionUsed);
	}
	if(version >= INNO_VERSION(5, 0, 4) && version < INNO_VERSION(5, 6, 1)) {
		flagreader.add(ChangesEnvironment);
	}
	if(version >= INNO_VERSION(5, 1, 7) && !version.is_unicode()) {
		flagreader.add(ShowUndisplayableLanguages);
	}
	if(version >= INNO_VERSION(5, 1, 13)) {
		flagreader.add(SetupLogging);
	}
	if(version >= INNO_VERSION(5, 2, 1)) {
		flagreader.add(SignedUninstaller);
	}
	if(version >= INNO_VERSION(5, 3, 8)) {
		flagreader.add(UsePreviousLanguage);
	}
	if(version >= INNO_VERSION(5, 3, 9)) {
		flagreader.add(DisableWelcomePage);
	}
	if(version >= INNO_VERSION(5, 5, 0)) {
		flagreader.add(CloseApplications);
		flagreader.add(RestartApplications);
		flagreader.add(AllowNetworkDrive);
	} else {
		options |= AllowNetworkDrive;
	}
	if(version >= INNO_VERSION(5, 5, 7)) {
		flagreader.add(ForceCloseApplications);
	}
	if(version >= INNO_VERSION(6, 0, 0)) {
		flagreader.add(AppNameHasConsts);
		flagreader.add(UsePreviousPrivileges);
		flagreader.add(WizardResizable);
	}
	if(version >= INNO_VERSION(6, 3, 0)) {
		flagreader.add(UninstallLogging);
	}
	
	return flagreader.finalize();
}